

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeCurve::~IfcEdgeCurve(IfcEdgeCurve *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcEdge.field_0x50 = 0x83e9e0;
  (this->super_IfcEdge).EdgeEnd.obj = (LazyObject *)(vtable + 0xb8);
  this[-1].SameSense._M_string_length = 0x83ea08;
  *(undefined8 *)((long)&this[-1].SameSense.field_2 + 8) = 0x83ea30;
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x83ea58;
  puVar1 = *(undefined1 **)
            &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18;
  if (puVar1 != &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.field_0x28) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcEdge.field_0x50);
  return;
}

Assistant:

IfcEdgeCurve() : Object("IfcEdgeCurve") {}